

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

TemporalVariableLookupPtr __thiscall
Lodtalk::LocalScope::addTemporal(LocalScope *this,Oop symbol,Node *localContext)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __enable_if_t<is_constructible<value_type,_pair<Oop,_shared_ptr<TemporalVariableLookup>_>_>::value,_pair<iterator,_bool>_>
  _Var1;
  TemporalVariableLookupPtr TVar2;
  pair<Lodtalk::Oop,_std::shared_ptr<Lodtalk::TemporalVariableLookup>_> local_68;
  _Base_ptr local_50;
  undefined1 local_48;
  undefined1 local_39;
  undefined1 local_38 [8];
  shared_ptr<Lodtalk::TemporalVariableLookup> variable;
  Node *localContext_local;
  LocalScope *this_local;
  Oop symbol_local;
  
  local_39 = 1;
  this_local = (LocalScope *)localContext;
  symbol_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)this;
  std::make_shared<Lodtalk::TemporalVariableLookup,Lodtalk::AST::Node*&,bool>
            ((Node **)local_38,
             (bool *)&variable.
                      super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  std::make_pair<Lodtalk::Oop&,std::shared_ptr<Lodtalk::TemporalVariableLookup>&>
            (&local_68,(Oop *)&this_local,(shared_ptr<Lodtalk::TemporalVariableLookup> *)local_38);
  _Var1 = std::
          map<Lodtalk::OopRef,std::shared_ptr<Lodtalk::VariableLookup>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
          ::insert<std::pair<Lodtalk::Oop,std::shared_ptr<Lodtalk::TemporalVariableLookup>>>
                    ((map<Lodtalk::OopRef,std::shared_ptr<Lodtalk::VariableLookup>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
                      *)((long)symbol.field_0 + 0x18),&local_68);
  local_50 = (_Base_ptr)_Var1.first._M_node;
  local_48 = _Var1.second;
  std::pair<Lodtalk::Oop,_std::shared_ptr<Lodtalk::TemporalVariableLookup>_>::~pair(&local_68);
  if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::shared_ptr<Lodtalk::TemporalVariableLookup>::shared_ptr
              ((shared_ptr<Lodtalk::TemporalVariableLookup> *)this);
  }
  else {
    std::shared_ptr<Lodtalk::TemporalVariableLookup>::shared_ptr
              ((shared_ptr<Lodtalk::TemporalVariableLookup> *)this,
               (shared_ptr<Lodtalk::TemporalVariableLookup> *)local_38);
  }
  std::shared_ptr<Lodtalk::TemporalVariableLookup>::~shared_ptr
            ((shared_ptr<Lodtalk::TemporalVariableLookup> *)local_38);
  TVar2.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  TVar2.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TemporalVariableLookupPtr)
         TVar2.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TemporalVariableLookupPtr LocalScope::addTemporal(Oop symbol, Node *localContext)
{
	auto variable = std::make_shared<TemporalVariableLookup> (localContext, true );
	if(variables.insert(std::make_pair(symbol, variable)).second)
        return variable;
    return TemporalVariableLookupPtr();
}